

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall Js::FunctionBody::DoInterpreterAutoProfile(FunctionBody *this)

{
  uint sourceContextId;
  code *pcVar1;
  bool bVar2;
  LocalFunctionId functionId;
  undefined4 *puVar3;
  
  bVar2 = DoInterpreterProfile(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1c1f,"(DoInterpreterProfile())","DoInterpreterProfile()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 2) == 0) {
    sourceContextId =
         ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
            m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01441eb0,InterpreterAutoProfilePhase,sourceContextId,
                              functionId);
    if (!bVar2) {
      bVar2 = FunctionProxy::IsInDebugMode((FunctionProxy *)this);
      return !bVar2;
    }
  }
  return false;
}

Assistant:

bool FunctionBody::DoInterpreterAutoProfile() const
    {
        Assert(DoInterpreterProfile());

#ifdef ASMJS_PLAT
        if (this->GetIsAsmjsMode()) return false;
#endif

        return !PHASE_OFF(InterpreterAutoProfilePhase, this) && !this->IsInDebugMode();
    }